

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H30_binary_tree.c
# Opt level: O0

void insert(int key)

{
  int *piVar1;
  NODE *n;
  NODE **p;
  int key_local;
  
  n = (NODE *)&root;
  while( true ) {
    if (*(long *)n == 0) {
      piVar1 = (int *)malloc(0x18);
      piVar1[2] = 0;
      piVar1[3] = 0;
      piVar1[4] = 0;
      piVar1[5] = 0;
      *piVar1 = key;
      *(int **)n = piVar1;
      return;
    }
    if (key == **(int **)n) break;
    if (key < **(int **)n) {
      n = (NODE *)(*(long *)n + 8);
    }
    else {
      n = (NODE *)(*(long *)n + 0x10);
    }
  }
  return;
}

Assistant:

void insert(int key) {
  NODE **p, *n;
  p = &root;
  while (*p != NULL) {
    if (key == (*p)->data)
      return;
    else if (key < (*p)->data)
      p = &(*p)->left;
    else
      p = &(*p)->right;
  }

  n = (NODE *)malloc(sizeof(NODE));
  n->left = NULL;
  n->right = NULL;
  n->data = key;
  *p = n;
}